

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::zoomInF(QTextEdit *this,float range)

{
  double dVar1;
  long in_FS_OFFSET;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((range != 0.0) || (NAN(range))) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    QFont::QFont((QFont *)&local_28,
                 &((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->fnt);
    dVar1 = (double)QFont::pointSizeF();
    if (0.0 < (float)((double)range + dVar1)) {
      QFont::setPointSizeF((double)(float)((double)range + dVar1));
      QWidget::setFont((QWidget *)this,(QFont *)&local_28);
    }
    QFont::~QFont((QFont *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::zoomInF(float range)
{
    if (range == 0.f)
        return;
    QFont f = font();
    const float newSize = f.pointSizeF() + range;
    if (newSize <= 0)
        return;
    f.setPointSizeF(newSize);
    setFont(f);
}